

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3BitvecDestroy(Bitvec *p)

{
  long in_RDI;
  uint i;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar1;
  
  if (in_RDI != 0) {
    if (*(int *)(in_RDI + 8) != 0) {
      for (uVar1 = 0; uVar1 < 0x3e; uVar1 = uVar1 + 1) {
        sqlite3BitvecDestroy((Bitvec *)CONCAT44(uVar1,in_stack_fffffffffffffff0));
      }
    }
    sqlite3_free((void *)0x163434);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BitvecDestroy(Bitvec *p){
  if( p==0 ) return;
  if( p->iDivisor ){
    unsigned int i;
    for(i=0; i<BITVEC_NPTR; i++){
      sqlite3BitvecDestroy(p->u.apSub[i]);
    }
  }
  sqlite3_free(p);
}